

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lutf8lib.c
# Opt level: O0

int byteoffset(lua_State *L)

{
  char *pcVar1;
  lua_Integer pos;
  bool bVar2;
  char *local_38;
  lua_Integer local_30;
  lua_Integer posi;
  lua_Integer n;
  char *s;
  size_t len;
  lua_State *L_local;
  
  len = (size_t)L;
  pcVar1 = luaL_checklstring(L,1,(size_t *)&s);
  posi = luaL_checkinteger((lua_State *)len,2);
  if (posi < 0) {
    local_38 = s + 1;
  }
  else {
    local_38 = (char *)0x1;
  }
  pos = luaL_optinteger((lua_State *)len,3,(lua_Integer)local_38);
  local_30 = u_posrelat(pos,(size_t)s);
  if ((local_30 < 1) || (local_30 = local_30 + -1, (long)s < local_30)) {
    luaL_argerror((lua_State *)len,3,"position out of range");
  }
  if (posi == 0) {
    while( true ) {
      bVar2 = false;
      if (0 < local_30) {
        bVar2 = ((int)pcVar1[local_30] & 0xc0U) == 0x80;
      }
      if (!bVar2) break;
      local_30 = local_30 + -1;
    }
  }
  else {
    if (((int)pcVar1[local_30] & 0xc0U) == 0x80) {
      luaL_error((lua_State *)len,"initial position is a continuation byte");
    }
    if (posi < 0) {
      for (; posi < 0 && 0 < local_30; posi = posi + 1) {
        do {
          local_30 = local_30 + -1;
          bVar2 = false;
          if (0 < local_30) {
            bVar2 = ((int)pcVar1[local_30] & 0xc0U) == 0x80;
          }
        } while (bVar2);
      }
    }
    else {
      while (posi = posi + -1, 0 < posi && local_30 < (long)s) {
        do {
          local_30 = local_30 + 1;
        } while (((int)pcVar1[local_30] & 0xc0U) == 0x80);
      }
    }
  }
  if (posi == 0) {
    lua_pushinteger((lua_State *)len,local_30 + 1);
  }
  else {
    lua_pushnil((lua_State *)len);
  }
  return 1;
}

Assistant:

static int byteoffset(lua_State *L) {
    size_t len;
    const char *s = luaL_checklstring(L, 1, &len);
    lua_Integer n = luaL_checkinteger(L, 2);
    lua_Integer posi = (n >= 0) ? 1 : len + 1;
    posi = u_posrelat(luaL_optinteger(L, 3, posi), len);
    luaL_argcheck(L, 1 <= posi && --posi <= (lua_Integer) len, 3,
                  "position out of range");
    if (n == 0) {
        /* find beginning of current byte sequence */
        while (posi > 0 && iscont(s + posi)) posi--;
    } else {
        if (iscont(s + posi))
            luaL_error(L, "initial position is a continuation byte");
        if (n < 0) {
            while (n < 0 && posi > 0) {  /* move back */
                do {  /* find beginning of previous character */
                    posi--;
                } while (posi > 0 && iscont(s + posi));
                n++;
            }
        } else {
            n--;  /* do not move for 1st character */
            while (n > 0 && posi < (lua_Integer) len) {
                do {  /* find beginning of next character */
                    posi++;
                } while (iscont(s + posi));  /* (cannot pass final '\0') */
                n--;
            }
        }
    }
    if (n == 0)  /* did it find given character? */
        lua_pushinteger(L, posi + 1);
    else  /* no such character */
        lua_pushnil(L);
    return 1;
}